

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTexelBlockStride
          (anon_unknown_0 *this,ImageInfo *info,int level)

{
  int i;
  long lVar1;
  int i_2;
  int iVar2;
  IVec3 IVar3;
  IVec3 size;
  IVec3 textureTexelBlockSize;
  IVec3 texelBlockPixelSize;
  int local_40 [4];
  int local_30 [3];
  anon_unknown_0 local_24 [12];
  
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  if (info->m_target == 0x8c1a) {
    lVar1 = 0;
    do {
      iVar2 = (info->m_size).m_data[lVar1] >> ((byte)level & 0x1f);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      local_40[lVar1] = iVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    local_40[2] = (info->m_size).m_data[2];
  }
  else {
    lVar1 = 0;
    do {
      iVar2 = (info->m_size).m_data[lVar1] >> ((byte)level & 0x1f);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      local_40[lVar1] = iVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  iVar2 = getTexelBlockSize(info->m_format);
  getTexelBlockPixelSize(local_24,info->m_format);
  local_30[0] = 0;
  local_30[1] = 0;
  lVar1 = 0;
  do {
    IVar3.m_data[2] = local_40[lVar1] % *(int *)(local_24 + lVar1 * 4);
    local_30[lVar1] =
         (local_40[lVar1] / *(int *)(local_24 + lVar1 * 4) + 1) - (uint)(IVar3.m_data[2] == 0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  *(int *)this = iVar2;
  *(int *)(this + 4) = local_30[0] * iVar2;
  *(int *)(this + 8) = local_30[1] * local_30[0] * iVar2;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

IVec3 getTexelBlockStride (const ImageInfo& info, int level)
{
	const IVec3	size					= getLevelSize(info.getTarget(), info.getSize(), level);
	const int	texelBlockSize			= getTexelBlockSize(info.getFormat());
	const IVec3 texelBlockPixelSize		= getTexelBlockPixelSize(info.getFormat());
	const IVec3 textureTexelBlockSize	= divRoundUp(size, texelBlockPixelSize);

	return IVec3(texelBlockSize, textureTexelBlockSize.x() * texelBlockSize, textureTexelBlockSize.x() * textureTexelBlockSize.y() * texelBlockSize);
}